

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

string * __thiscall
kratos::port_type_to_str_abi_cxx11_(string *__return_storage_ptr__,kratos *this,PortType type)

{
  runtime_error *this_00;
  undefined4 in_register_00000014;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_1d;
  allocator<char> local_1c;
  allocator<char> local_1b;
  allocator<char> local_1a;
  allocator<char> local_19;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "data";
    __a = &local_1c;
    break;
  case 1:
    __s = "clk";
    __a = &local_1a;
    break;
  case 2:
    __s = "async_reset";
    __a = &local_19;
    break;
  case 3:
    __s = "reset";
    __a = &local_1d;
    break;
  case 4:
    __s = "clk_en";
    __a = &local_1b;
    break;
  default:
    this_00 = (runtime_error *)
              __cxa_allocate_exception(0x10,this,CONCAT44(in_register_00000014,type));
    std::runtime_error::runtime_error(this_00,"unknown port type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string port_type_to_str(PortType type) {
    switch (type) {
        case PortType::Reset:
            return "reset";
        case PortType::Data:
            return "data";
        case PortType ::ClockEnable:
            return "clk_en";
        case PortType ::Clock:
            return "clk";
        case PortType ::AsyncReset:
            return "async_reset";
        default:
            throw std::runtime_error("unknown port type");
    }
}